

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

void hydro_random_buf_deterministic(void *out,size_t out_len,uint8_t *seed)

{
  ulong uVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint8_t state [48];
  
  mem_zero(state,0x30);
  builtin_memcpy(state,"\adrbg256",8);
  state._8_8_ = out_len;
  gimli_core_u8(state,'\x01');
  mem_xor(state,seed,0x10);
  gimli_core_u8(state,'\x02');
  mem_xor(state,seed + 0x10,0x10);
  gimli_core_u8(state,'\x02');
  uVar1 = out_len >> 4;
  puVar2 = (uint8_t *)out;
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    gimli_core_u8(state,'\0');
    *(undefined8 *)puVar2 = state._0_8_;
    *(undefined8 *)(puVar2 + 8) = state._8_8_;
    puVar2 = puVar2 + 0x10;
  }
  if ((out_len & 0xf) != 0) {
    gimli_core_u8(state,'\0');
    mem_cpy((void *)((long)out + (out_len & 0xfffffffffffffff0)),state,out_len & 0xf);
  }
  return;
}

Assistant:

void
hydro_random_buf_deterministic(void *out, size_t out_len,
                               const uint8_t seed[hydro_random_SEEDBYTES])
{
    static const uint8_t             prefix[] = { 7, 'd', 'r', 'b', 'g', '2', '5', '6' };
    _hydro_attr_aligned_(16) uint8_t state[gimli_BLOCKBYTES];
    uint8_t                         *p = (uint8_t *) out;
    size_t                           i;
    size_t                           leftover;

    mem_zero(state, gimli_BLOCKBYTES);
    COMPILER_ASSERT(sizeof prefix + 8 <= gimli_RATE);
    memcpy(state, prefix, sizeof prefix);
    STORE64_LE(state + sizeof prefix, (uint64_t) out_len);
    gimli_core_u8(state, 1);
    COMPILER_ASSERT(hydro_random_SEEDBYTES == gimli_RATE * 2);
    mem_xor(state, seed, gimli_RATE);
    gimli_core_u8(state, 2);
    mem_xor(state, seed + gimli_RATE, gimli_RATE);
    gimli_core_u8(state, 2);
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(state, 0);
        memcpy(p + i * gimli_RATE, state, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(state, 0);
        mem_cpy(p + i * gimli_RATE, state, leftover);
    }
}